

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O3

int tnt_connect(tnt_stream *s)

{
  tnt_stream_net *s_00;
  uri *puVar1;
  void *pvVar2;
  long lVar3;
  tnt_error tVar4;
  int iVar5;
  ssize_t sVar6;
  undefined1 local_a0 [8];
  tnt_reply rep;
  
  s_00 = (tnt_stream_net *)s->data;
  if (s_00->inited == 0) {
    tnt_init(s);
  }
  if (s_00->connected != 0) {
    tnt_close(s);
  }
  tVar4 = tnt_io_connect(s_00);
  s_00->error = tVar4;
  iVar5 = -1;
  if (((tVar4 == TNT_EOK) && (sVar6 = (*s->read)(s,s_00->greeting,0x80), sVar6 != -1)) &&
     (s_00->error == TNT_EOK)) {
    puVar1 = (s_00->opt).uri;
    if ((puVar1->login != (char *)0x0) && (puVar1->password != (char *)0x0)) {
      pvVar2 = s->data;
      if (*(int *)((long)pvVar2 + 0x78) == 0) {
        return -1;
      }
      if (s->wrcnt != 0) {
        return -1;
      }
      lVar3 = *(long *)((long)pvVar2 + 8);
      tnt_auth(s,*(char **)(lVar3 + 0x10),*(int *)(lVar3 + 0x18),*(char **)(lVar3 + 0x20),
               *(int *)(lVar3 + 0x28));
      tnt_io_flush((tnt_stream_net *)s->data);
      tnt_reply_init((tnt_reply *)local_a0);
      iVar5 = (*s->read_reply)(s,(tnt_reply *)local_a0);
      if (iVar5 == -1) {
        return -1;
      }
      if (rep.schema_id != 0) {
        if (rep.buf_size != 0x2f) {
          return -1;
        }
        *(undefined4 *)((long)pvVar2 + 0xf0) = 9;
        return -1;
      }
      tnt_reply_free((tnt_reply *)local_a0);
      tnt_reload_schema(s);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int tnt_connect(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (!sn->inited) tnt_init(s);
	if (sn->connected)
		tnt_close(s);
	sn->error = tnt_io_connect(sn);
	if (sn->error != TNT_EOK)
		return -1;
	if (s->read(s, sn->greeting, TNT_GREETING_SIZE) == -1 ||
	    sn->error != TNT_EOK)
		return -1;
	if (sn->opt.uri->login && sn->opt.uri->password)
		if (tnt_authenticate(s) == -1)
			return -1;
	return 0;
}